

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O2

unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
 __thiscall ApplicationFactory::makeEventsProcessor(ApplicationFactory *this,Context *context)

{
  Context CVar1;
  unique_ptr<solitaire::events::SDLEventsSource,_std::default_delete<solitaire::events::SDLEventsSource>_>
  *in_RDX;
  _Head_base<0UL,_solitaire::SDL::Wrapper_*,_false> local_30;
  long *local_28;
  Context local_20;
  
  std::make_unique<solitaire::SDL::Wrapper>();
  std::
  make_unique<solitaire::events::SDLEventsSource,std::unique_ptr<solitaire::SDL::Wrapper,std::default_delete<solitaire::SDL::Wrapper>>>
            ((unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> *)
             &local_30);
  std::
  make_unique<solitaire::events::EventsProcessor,solitaire::interfaces::Context&,std::unique_ptr<solitaire::events::SDLEventsSource,std::default_delete<solitaire::events::SDLEventsSource>>>
            (&local_20,in_RDX);
  CVar1._vptr_Context = local_20._vptr_Context;
  local_20._vptr_Context = (_func_int **)0x0;
  *(_func_int ***)this = CVar1._vptr_Context;
  if (local_30._M_head_impl != (Wrapper *)0x0) {
    (*((local_30._M_head_impl)->super_Wrapper)._vptr_Wrapper[1])();
  }
  local_30._M_head_impl = (Wrapper *)0x0;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
          )(__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<events::interfaces::EventsProcessor>
ApplicationFactory::makeEventsProcessor(
    solitaire::interfaces::Context& context) const
{
    return std::make_unique<EventsProcessor>(
        context,
        std::make_unique<SDLEventsSource>(
            std::make_unique<SDL::Wrapper>()
        )
    );
}